

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> * __thiscall
tinyusdz::lerp<std::array<double,4ul>>
          (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *a,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *b,double t)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  pointer paVar4;
  pointer paVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ulong uVar12;
  long lVar13;
  ulong __new_size;
  double dVar14;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar12 = *(long *)(this + 8) - *(long *)this >> 5;
  __new_size = (long)(a->
                     super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar12 <= __new_size) {
    __new_size = uVar12;
  }
  if (__new_size != 0) {
    ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::resize
              (__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      dVar14 = 1.0 - t;
      lVar13 = 0x10;
      do {
        paVar4 = (a->
                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        paVar5 = (__return_storage_ptr__->
                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar2 = (double *)(*(long *)this + -0x10 + lVar13);
        dVar6 = pdVar2[1];
        pdVar1 = (double *)(*(long *)this + lVar13);
        dVar7 = *pdVar1;
        dVar8 = pdVar1[1];
        pdVar3 = (double *)((long)paVar4->_M_elems + lVar13 + -0x10);
        dVar9 = pdVar3[1];
        pdVar1 = (double *)((long)paVar4->_M_elems + lVar13);
        dVar10 = *pdVar1;
        dVar11 = pdVar1[1];
        pdVar1 = (double *)((long)paVar5->_M_elems + lVar13 + -0x10);
        *pdVar1 = *pdVar3 * t + *pdVar2 * dVar14;
        pdVar1[1] = dVar9 * t + dVar6 * dVar14;
        pdVar1 = (double *)((long)paVar5->_M_elems + lVar13);
        *pdVar1 = dVar10 * t + dVar7 * dVar14;
        pdVar1[1] = dVar11 * t + dVar8 * dVar14;
        lVar13 = lVar13 + 0x20;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}